

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

bool google::protobuf::internal::WireFormat::ParseAndMergeMessageSetItem
               (CodedInputStream *input,Message *message)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  uint32 uVar4;
  uint uVar5;
  uint uVar6;
  FieldDescriptor *pFVar7;
  ulong uVar8;
  Reflection *this;
  uint32 field_number;
  uint size;
  byte *pbVar9;
  byte *pbVar10;
  string message_data;
  byte *local_a0;
  long local_98;
  byte local_90 [16];
  CodedInputStream local_80;
  
  (*(message->super_MessageLite)._vptr_MessageLite[0x15])(message);
  local_98 = 0;
  local_90[0] = 0;
  uVar8 = 0;
  local_a0 = local_90;
LAB_002acc38:
  do {
    pbVar9 = input->buffer_;
    if (pbVar9 < input->buffer_end_) {
      uVar4 = (uint32)*pbVar9;
      if ((char)*pbVar9 < '\0') goto LAB_002acc52;
      input->buffer_ = pbVar9 + 1;
    }
    else {
      uVar4 = 0;
LAB_002acc52:
      uVar4 = io::CodedInputStream::ReadTagFallback(input,uVar4);
    }
    field_number = (uint32)uVar8;
    if ((int)uVar4 < 0x1a) {
      if (uVar4 != 0) {
        if (uVar4 == 0xc) {
          uVar8 = 1;
          goto LAB_002ace60;
        }
        if (uVar4 != 0x10) goto LAB_002acc9c;
        pbVar9 = input->buffer_;
        if (pbVar9 < input->buffer_end_) {
          bVar1 = *pbVar9;
          uVar8 = (ulong)bVar1;
          uVar4 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_002accf0;
          input->buffer_ = pbVar9 + 1;
        }
        else {
          uVar4 = 0;
LAB_002accf0:
          uVar8 = io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
          if ((long)uVar8 < 0) goto LAB_002ace5e;
        }
        if (local_98 == 0) goto LAB_002acc38;
        local_80.buffer_ = local_a0;
        local_80.total_bytes_read_ = (int)local_98;
        local_80.buffer_end_ = local_a0 + local_80.total_bytes_read_;
        local_80.input_ = (ZeroCopyInputStream *)0x0;
        local_80.overflow_bytes_ = 0;
        local_80.last_tag_ = 0;
        local_80.legitimate_message_end_ = false;
        local_80.aliasing_enabled_ = false;
        local_80.buffer_size_after_limit_ = 0;
        local_80.total_bytes_limit_ = 0x7fffffff;
        local_80.extension_pool_ = (DescriptorPool *)0x0;
        local_80.extension_factory_ = (MessageFactory *)0x0;
        local_80.recursion_budget_ = input->recursion_budget_;
        local_80.current_limit_ = local_80.total_bytes_read_;
        local_80.recursion_limit_ = local_80.recursion_budget_;
        pFVar7 = Reflection::FindKnownExtensionByNumber(this,(uint32)uVar8);
        bVar3 = ParseAndMergeMessageSetField((uint32)uVar8,pFVar7,message,&local_80);
        if (bVar3) {
          local_98 = 0;
          *local_a0 = 0;
          io::CodedInputStream::~CodedInputStream(&local_80);
          goto LAB_002acc38;
        }
        io::CodedInputStream::~CodedInputStream(&local_80);
      }
LAB_002ace5e:
      uVar8 = 0;
      goto LAB_002ace60;
    }
    if (uVar4 == 0x1a) {
      if (field_number != 0) {
        pFVar7 = Reflection::FindKnownExtensionByNumber(this,field_number);
        bVar3 = ParseAndMergeMessageSetField(field_number,pFVar7,message,input);
        goto LAB_002acca8;
      }
      pbVar9 = input->buffer_;
      if (pbVar9 < input->buffer_end_) {
        bVar1 = *pbVar9;
        uVar8 = (ulong)bVar1;
        uVar4 = (uint32)bVar1;
        if ((char)bVar1 < '\0') goto LAB_002acdad;
        input->buffer_ = pbVar9 + 1;
      }
      else {
        uVar4 = 0;
LAB_002acdad:
        uVar8 = io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
        if ((uVar8 & 0x8000000080000000) != 0) goto LAB_002ace5e;
      }
      size = (uint)uVar8;
      iVar2 = 0x1f;
      if ((size | 1) != 0) {
        for (; (size | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      bVar1 = (byte)uVar8;
      std::__cxx11::string::resize((ulong)&local_a0,(char)(iVar2 * 9 + 0x49U >> 6) + bVar1);
      if (size < 0x80) {
        *local_a0 = bVar1;
        pbVar9 = local_a0 + 1;
      }
      else {
        *local_a0 = bVar1 | 0x80;
        uVar8 = uVar8 >> 7 & 0x1ffffff;
        if (size < 0x4000) {
          local_a0[1] = (byte)uVar8;
          pbVar9 = local_a0 + 2;
        }
        else {
          pbVar9 = local_a0 + 2;
          do {
            pbVar10 = pbVar9;
            uVar5 = (uint)uVar8;
            pbVar10[-1] = (byte)uVar8 | 0x80;
            uVar6 = uVar5 >> 7;
            uVar8 = (ulong)uVar6;
            pbVar9 = pbVar10 + 1;
          } while (0x3fff < uVar5);
          *pbVar10 = (byte)uVar6;
        }
      }
      bVar3 = io::CodedInputStream::ReadRaw(input,pbVar9,size);
      uVar8 = 0;
      if (!bVar3) {
LAB_002ace60:
        if (local_a0 != local_90) {
          operator_delete(local_a0);
        }
        return SUB81(uVar8,0);
      }
    }
    else {
LAB_002acc9c:
      bVar3 = SkipField(input,uVar4,(UnknownFieldSet *)0x0);
LAB_002acca8:
      if (bVar3 == false) goto LAB_002ace5e;
    }
  } while( true );
}

Assistant:

bool WireFormat::ParseAndMergeMessageSetItem(io::CodedInputStream* input,
                                             Message* message) {
  struct MSReflective {
    bool ParseField(int type_id, io::CodedInputStream* input) {
      const FieldDescriptor* field =
          message_reflection->FindKnownExtensionByNumber(type_id);
      return ParseAndMergeMessageSetField(type_id, field, message, input);
    }

    bool SkipField(uint32 tag, io::CodedInputStream* input) {
      return WireFormat::SkipField(input, tag, NULL);
    }

    const Reflection* message_reflection;
    Message* message;
  };

  return ParseMessageSetItemImpl(
      input, MSReflective{message->GetReflection(), message});
}